

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

INode * __thiscall
COLLADASaxFWL::FormulasLoader::createFunctionOperation
          (FormulasLoader *this,NodeVector *nodes,Operator op)

{
  INode *pIVar1;
  String *name;
  int in_EDX;
  undefined8 in_RSI;
  FunctionExpression *expression;
  String *functionName;
  FunctionExpression *in_stack_ffffffffffffffc0;
  
  name = (String *)(ulong)(in_EDX - 0xe);
  switch(name) {
  case (String *)0x0:
    break;
  case (String *)0x1:
    break;
  case (String *)0x2:
    break;
  case (String *)0x3:
    break;
  case (String *)0x4:
    break;
  case (String *)0x5:
    break;
  case (String *)0x6:
    break;
  case (String *)0x7:
    break;
  case (String *)0x8:
    break;
  case (String *)0x9:
    break;
  case (String *)0xa:
    break;
  case (String *)0xb:
    break;
  case (String *)0xc:
    break;
  case (String *)0xd:
    break;
  case (String *)0xe:
    break;
  case (String *)0xf:
    break;
  case (String *)0x10:
    break;
  case (String *)0x11:
    break;
  case (String *)0x12:
    break;
  case (String *)0x13:
    break;
  case (String *)0x14:
    break;
  case (String *)0x15:
    break;
  case (String *)0x16:
    break;
  case (String *)0x17:
    break;
  case (String *)0x18:
    break;
  case (String *)0x19:
    break;
  case (String *)0x1a:
    break;
  case (String *)0x1b:
    break;
  case (String *)0x1c:
    break;
  case (String *)0x1d:
    break;
  case (String *)0x1e:
    break;
  case (String *)0x1f:
    break;
  case (String *)0x20:
    break;
  case (String *)0x21:
    break;
  case (String *)0x22:
    break;
  case (String *)0x23:
    break;
  case (String *)0x24:
    break;
  case (String *)0x25:
    break;
  default:
    return (INode *)0x0;
  }
  pIVar1 = (INode *)operator_new(0x40);
  MathML::AST::FunctionExpression::FunctionExpression(in_stack_ffffffffffffffc0,name);
  (*pIVar1->_vptr_INode[8])(pIVar1,in_RSI);
  return pIVar1;
}

Assistant:

MathML::AST::INode* FormulasLoader::createFunctionOperation( const NodeVector& nodes, Operator op )
	{
		const MathML::String* functionName;
		switch ( op )
		{
		case POW:
			functionName = &MathML::FUNCTION_POW;
			break;
		case FACTORIAL:
			functionName = &MathML::FUNCTION_FACTORIAL;
			break;
		case ABS:
			functionName = &MathML::FUNCTION_ABS;
			break;
		case EXP:
			functionName = &MathML::FUNCTION_EXP;
			break;
		case LN:
			functionName = &MathML::FUNCTION_LOGN;
			break;
		case MIN:
			functionName = &MathML::FUNCTION_MIN;
			break;
		case MAX:
			functionName = &MathML::FUNCTION_MAX;
			break;
		case CEIL:
			functionName = &MathML::FUNCTION_CEILING;
			break;
		case FLOOR:
			functionName = &MathML::FUNCTION_FLOOR;
			break;
		case GCD:
			functionName = &MathML::FUNCTION_GCD;
			break;
		case LCM:
			functionName = &MathML::FUNCTION_LCM;
			break;
		case REM:
			functionName = &MathML::FUNCTION_REM;
			break;
		case ROOT:
			functionName = &MathML::FUNCTION_ROOT;
			break;
		case LOG:
			functionName = &MathML::FUNCTION_LOG;
			break;
		case SIN:
			functionName = &MathML::FUNCTION_SIN;
			break;
		case COS:
			functionName = &MathML::FUNCTION_COS;
			break;
		case TAN:
			functionName = &MathML::FUNCTION_TAN;
			break;
		case SEC:
			functionName = &MathML::FUNCTION_SEC;
			break;
		case CSC:
			functionName = &MathML::FUNCTION_CSC;
			break;
		case COT:
			functionName = &MathML::FUNCTION_COT;
			break;
		case ARCSIN:
			functionName = &MathML::FUNCTION_ARCSIN;
			break;
		case ARCCOS:
			functionName = &MathML::FUNCTION_ARCCOS;
			break;
		case ARCTAN:
			functionName = &MathML::FUNCTION_ARCTAN;
			break;
		case ARCSEC:
			functionName = &MathML::FUNCTION_ARCSEC;
			break;
		case ARCCSC:
			functionName = &MathML::FUNCTION_ARCCSC;
			break;
		case ARCCOT:
			functionName = &MathML::FUNCTION_ARCCOT;
			break;
		case SINH:
			functionName = &MathML::FUNCTION_SINH;
			break;
		case COSH:
			functionName = &MathML::FUNCTION_COSH;
			break;
		case TANH:
			functionName = &MathML::FUNCTION_TANH;
			break;
		case SECH:
			functionName = &MathML::FUNCTION_SECH;
			break;
		case CSCH:
			functionName = &MathML::FUNCTION_CSCH;
			break;
		case COTH:
			functionName = &MathML::FUNCTION_COTH;
			break;
		case ARCSINH:
			functionName = &MathML::FUNCTION_ARCSINH;
			break;
		case ARCCOSH:
			functionName = &MathML::FUNCTION_ARCCOSH;
			break;
		case ARCTANH:
			functionName = &MathML::FUNCTION_ARCTANH;
			break;
		case ARCCOTH:
			functionName = &MathML::FUNCTION_ARCCOTH;
			break;
		case ARCSECH:
			functionName = &MathML::FUNCTION_ARCSECH;
			break;
		case ARCCSCH:
			functionName = &MathML::FUNCTION_ARCCSCH;
			break;
		default:
			// invalid operator
			return 0;
		}

		MathML::AST::FunctionExpression* expression = new MathML::AST::FunctionExpression( *functionName );
		expression->setParameterList( nodes );

		return expression;
	}